

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool sleep_internal(unsigned_long time)

{
  clock_t cVar1;
  clock_t cVar2;
  undefined1 auVar3 [16];
  
  cVar1 = clock();
  auVar3._8_4_ = (int)(time >> 0x20);
  auVar3._0_8_ = time;
  auVar3._12_4_ = 0x45300000;
  do {
    cVar2 = clock();
    if (cVar2 == -1) break;
  } while (((double)(cVar2 - cVar1) * 1000.0) / 1000000.0 <
           (auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)time) - 4503599627370496.0));
  return cVar2 != -1;
}

Assistant:

bool sleep_internal(unsigned long time)
{
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	Sleep(time);
#else
	clock_t start = clock();
	clock_t end;
	do
	{
		if ((end = clock()) == (clock_t)-1)
		{
			return false;
		}
	} while (1000.0 * (end - start) / CLOCKS_PER_SEC < time);
#endif
	return true;
}